

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool ScanBoolean(ConfigScanner *sc)

{
  int iVar1;
  char *__s1;
  _Bool _Var2;
  _Bool _Var3;
  
  if ((sc == (ConfigScanner *)0x0) || (__s1 = GetString(sc), __s1 == (char *)0x0)) {
    return false;
  }
  iVar1 = strcmp(__s1,"true");
  _Var3 = true;
  _Var2 = true;
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"false");
    _Var2 = false;
    if (iVar1 != 0) {
      _Var3 = false;
      goto LAB_0014c4be;
    }
  }
  sc->current_boolean = _Var2;
  sc->vtype = VTYPE_BOOLEAN;
LAB_0014c4be:
  free(__s1);
  return _Var3;
}

Assistant:

bool ScanBoolean(ConfigScanner *sc)
{
	bool result = false;
	if (sc == NULL)
	{
		return result;
	}
	char *str = GetString(sc);
	if (str == NULL)
	{
		return result;
	}
	if (strcmp(str, "true") == 0)
	{
		sc->current_boolean = true;
		sc->vtype = VTYPE_BOOLEAN;
		result = true;
	}
	else if (strcmp(str, "false") == 0)
	{
		sc->current_boolean = false;
		sc->vtype = VTYPE_BOOLEAN;
		result = true;
	}
	free(str);
	return result;
}